

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O2

void __thiscall
AppParametersTest_switch_and_value_Test::~AppParametersTest_switch_and_value_Test
          (AppParametersTest_switch_and_value_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AppParametersTest, switch_and_value) {
	ArgWrapper args{ "/path/to/exe", "--switch", "-key", "value" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 3U);
	EXPECT_EQ(parameters.switches().size(), 1U);
	EXPECT_EQ(parameters.switches_set().size(), 1U);
	EXPECT_EQ(parameters.values().size(), 1U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"--switch", u8"-key", u8"value" };
	std::vector<std::u8string> expected_switches{ u8"switch" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"value" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Switches"], expected_switches);
	EXPECT_EQ(obj[u8"Values"], expected_values);

	EXPECT_TRUE(parameters.has_switch(u8"switch"));
	EXPECT_FALSE(parameters.has_switch(u8"switch2"));
	EXPECT_EQ(parameters.get_value(u8"key"), u8"value");
}